

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int vdbeMemAddTerminator(Mem *pMem)

{
  byte *pbVar1;
  uint uVar2;
  char *pcVar3;
  
  uVar2 = sqlite3VdbeMemGrow(pMem,pMem->n + 2,1);
  pcVar3 = (char *)(ulong)uVar2;
  if (uVar2 == 0) {
    pMem->z[pMem->n] = '\0';
    pcVar3 = pMem->z;
    pcVar3[(long)pMem->n + 1] = '\0';
    pbVar1 = (byte *)((long)&pMem->flags + 1);
    *pbVar1 = *pbVar1 | 2;
  }
  return (int)pcVar3;
}

Assistant:

static SQLITE_NOINLINE int vdbeMemAddTerminator(Mem *pMem){
  if( sqlite3VdbeMemGrow(pMem, pMem->n+2, 1) ){
    return SQLITE_NOMEM_BKPT;
  }
  pMem->z[pMem->n] = 0;
  pMem->z[pMem->n+1] = 0;
  pMem->flags |= MEM_Term;
  return SQLITE_OK;
}